

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symArrays.cpp
# Opt level: O0

bool ValidInput(char **argv,int *numbers)

{
  long lVar1;
  ostream *poVar2;
  char *local_28;
  char *endPtr;
  int i;
  bool validNumbers;
  int *numbers_local;
  char **argv_local;
  
  endPtr._7_1_ = 1;
  _i = numbers;
  numbers_local = (int *)argv;
  for (endPtr._0_4_ = 1; (int)endPtr < 4; endPtr._0_4_ = (int)endPtr + 1) {
    lVar1 = strtol(*(char **)(numbers_local + (long)(int)endPtr * 2),&local_28,10);
    if (lVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Invalid num at argument ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)endPtr);
      poVar2 = std::operator<<(poVar2,"!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      endPtr._7_1_ = 0;
    }
    else {
      lVar1 = strtol(*(char **)(numbers_local + (long)(int)endPtr * 2),&local_28,10);
      _i[(int)endPtr + -1] = (int)lVar1;
      if (_i[(int)endPtr + -1] < 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Invalid num at argument ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)endPtr);
        poVar2 = std::operator<<(poVar2,"!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"Numbers must be positive.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        endPtr._7_1_ = 0;
      }
    }
  }
  return (bool)(endPtr._7_1_ & 1);
}

Assistant:

bool ValidInput(char *argv[], int numbers[])
{
    bool validNumbers = true;

    for(int i = 1; i < 4; i++)
    {

        char *endPtr;
        if(strtol(argv[i], &endPtr, 10))
        {
            numbers[i - 1] = static_cast<int>(strtol(argv[i], &endPtr, 10));

            if(numbers[i - 1] <= 0)
            {
                cout << "Invalid num at argument " << i << "!" << endl;
                cout << "Numbers must be positive." << endl;
                validNumbers = false;
            }
        }
        else
        {
            cout << "Invalid num at argument " << i << "!" << endl;
            validNumbers = false;
        }
    }

    return validNumbers;

}